

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::processMidiTempoWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  char local_1b;
  char local_1a;
  char local_19;
  
  if (1 < word->_M_string_length) {
    pcVar2 = (word->_M_dataplus)._M_p;
    bVar1 = pcVar2[1];
    if (((int)(char)bVar1 - 0x30U < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)))) {
      dVar5 = strtod(pcVar2 + 1,(char **)0x0);
      dVar6 = -dVar5;
      if (-dVar5 <= dVar5) {
        dVar6 = dVar5;
      }
      iVar4 = (int)(60000000.0 / dVar6 + 0.5);
      local_1a = (char)((uint)iVar4 >> 0x10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_1a,1);
      local_1b = (char)((uint)iVar4 >> 8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1b,1);
      local_19 = (char)iVar4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
      return 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line: ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": \'t\' needs to be followed immediately by ",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a floating-point number",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processMidiTempoWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value < 0.0) {
		value = -value;
	}

	int intval = int(60.0 * 1000000.0 / value + 0.5);

	uchar byte0 = intval & 0xff;
	uchar byte1 = (intval >>  8) & 0xff;
	uchar byte2 = (intval >> 16) & 0xff;
	out << byte2 << byte1 << byte0;
	return 1;
}